

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O3

Expression * __thiscall
EOPlus::Parser::ParseExpression(Expression *__return_storage_ptr__,Parser *this)

{
  variant *this_00;
  Parser_Token_Server_Base *pPVar1;
  bool bVar2;
  int iVar3;
  runtime_error *prVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  Token *t_00;
  Token *t_01;
  Token *t_02;
  Token *t_03;
  int iVar8;
  Token tt;
  Token t;
  string local_3a8;
  Expression *local_388;
  string local_380;
  undefined1 local_360 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340 [2];
  undefined1 local_320 [24];
  string local_308 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Elt_pointer local_2e8;
  var_type local_2e0;
  int local_2d8;
  deque<util::variant,std::allocator<util::variant>> *local_2d0;
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  undefined1 local_2a8 [24];
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  bool local_270;
  bool bStack_26f;
  bool bStack_26e;
  bool bStack_26d;
  bool bStack_26c;
  undefined3 uStack_26b;
  var_type local_268;
  int local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  string local_210;
  undefined1 local_1f0 [56];
  var_type local_1b8;
  variant local_1b0;
  Token local_170;
  Token local_120;
  Token local_d0;
  Token local_80;
  
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->scopes).super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_M_initialize_map
            ((_Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)__return_storage_ptr__,0)
  ;
  (__return_storage_ptr__->function)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->function).field_2;
  (__return_storage_ptr__->function)._M_string_length = 0;
  (__return_storage_ptr__->function).field_2._M_local_buf[0] = '\0';
  local_2d0 = (deque<util::variant,std::allocator<util::variant>> *)&__return_storage_ptr__->args;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_388 = __return_storage_ptr__;
  std::_Deque_base<util::variant,_std::allocator<util::variant>_>::_M_initialize_map
            ((_Deque_base<util::variant,_std::allocator<util::variant>_> *)local_2d0,0);
  util::variant::variant(&local_1b0);
  local_2a8._0_4_ = Invalid;
  local_2a8._8_4_ = local_1b0.val_int;
  local_2a8._12_4_ = local_1b0._4_4_;
  local_2a8._16_4_ = local_1b0.val_float._0_4_;
  local_2a8._20_4_ = local_1b0.val_float._4_4_;
  local_290._M_p = (pointer)&local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_1b0.val_string._M_dataplus._M_p,
             local_1b0.val_string._M_dataplus._M_p + local_1b0.val_string._M_string_length);
  local_268 = local_1b0.type;
  local_270 = local_1b0.val_bool;
  bStack_26f = local_1b0.cache_val[0];
  bStack_26e = local_1b0.cache_val[1];
  bStack_26d = local_1b0.cache_val[2];
  bStack_26c = local_1b0.cache_val[3];
  uStack_26b = local_1b0._53_3_;
  local_260 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.val_string._M_dataplus._M_p != &local_1b0.val_string.field_2) {
    operator_delete(local_1b0.val_string._M_dataplus._M_p,
                    local_1b0.val_string.field_2._M_allocated_capacity + 1);
  }
  bVar2 = GetToken(this,(Token *)local_2a8,1);
  if (bVar2) {
    this_00 = (variant *)(local_2a8 + 8);
    util::variant::GetString_abi_cxx11_((string *)local_320,this_00);
    iVar3 = std::__cxx11::string::compare(local_320);
    if ((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_) != local_320 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_),
                      CONCAT44(local_320._20_4_,local_320._16_4_) + 1);
    }
    if (iVar3 == 0) {
      util::variant::variant((variant *)local_1f0);
      local_320._0_4_ = Invalid;
      local_320._8_4_ = local_1f0._0_4_;
      local_320._12_4_ = local_1f0._4_4_;
      local_320._16_4_ = local_1f0._8_4_;
      local_320._20_4_ = local_1f0._12_4_;
      local_308._0_8_ = &local_2f8;
      std::__cxx11::string::_M_construct<char*>
                (local_308,local_1f0._16_8_,(pointer)(local_1f0._16_8_ + local_1f0._24_8_));
      local_2e0 = local_1b8;
      local_2e8 = (_Elt_pointer)local_1f0._48_8_;
      local_2d8 = 0;
      if ((undefined1 *)local_1f0._16_8_ != local_1f0 + 0x20) {
        operator_delete((void *)local_1f0._16_8_,local_1f0._32_8_ + 1);
      }
      bVar2 = GetToken(this,(Token *)local_320,1);
      if (!bVar2) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_380,"Expected identifier after \'goto\'.","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_380);
        local_3a8._M_dataplus._M_p = (pointer)*plVar5;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_3a8._M_dataplus._M_p == psVar7) {
          local_3a8.field_2._M_allocated_capacity = *psVar7;
          local_3a8.field_2._8_8_ = plVar5[3];
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        }
        else {
          local_3a8.field_2._M_allocated_capacity = *psVar7;
        }
        local_3a8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Parser_Token_Server_Base::RejectToken
                  (&local_80,
                   (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
        token_got_string_abi_cxx11_(&local_210,(EOPlus *)&local_80,t_03);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,&local_3a8,&local_210);
        pPVar1 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar3 = pPVar1->line;
        iVar8 = pPVar1->reject_line;
        std::runtime_error::runtime_error(prVar4,(string *)local_360);
        if (iVar8 < iVar3) {
          iVar8 = iVar3;
        }
        *(int *)(prVar4 + 0x10) = iVar8;
        *(undefined ***)prVar4 = &PTR__runtime_error_001d17c8;
        __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&__return_storage_ptr__->function,0,
                 (char *)(local_388->function)._M_string_length,0x1a452f);
      util::variant::GetString_abi_cxx11_(&local_3a8,(variant *)(local_320 + 8));
      util::variant::variant((variant *)local_360,&local_3a8);
      std::deque<util::variant,std::allocator<util::variant>>::_M_assign_aux<util::variant_const*>
                (local_2d0,local_360,local_320);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._16_8_ != local_340) {
        operator_delete((void *)local_360._16_8_,local_340[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._0_8_ != &local_2f8) {
        operator_delete((void *)local_308._0_8_,local_2f8._M_allocated_capacity + 1);
      }
    }
    else {
      ParseScopes((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_320,this);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::_M_move_assign1
                (&local_388->scopes,
                 (deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_320);
      std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                ((deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_> *)local_320);
      util::variant::GetString_abi_cxx11_((string *)local_320,this_00);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->function,(string *)local_320);
      if ((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_) != local_320 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_320._4_4_,local_320._0_4_),
                        CONCAT44(local_320._20_4_,local_320._16_4_) + 1);
      }
      local_238._M_unused._M_object = (void *)0x0;
      local_238._8_8_ = 0;
      local_220 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:227:29)>
                  ::_M_invoke;
      local_228 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:227:29)>
                  ::_M_manager;
      bVar2 = GetTokenIf(this,(Token *)local_2a8,
                         (function<bool_(const_EOPlus::Token_&)> *)&local_238,0x20);
      if (local_228 != (code *)0x0) {
        (*local_228)(&local_238,&local_238,__destroy_functor);
      }
      if (!bVar2) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3a8,"Expected \'(\' after function-name.","");
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
        local_360._0_8_ = *plVar5;
        plVar6 = plVar5 + 2;
        if ((long *)local_360._0_8_ == plVar6) {
          local_360._16_8_ = *plVar6;
          local_360._24_8_ = plVar5[3];
          local_360._0_8_ = local_360 + 0x10;
        }
        else {
          local_360._16_8_ = *plVar6;
        }
        local_360._8_8_ = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        Parser_Token_Server_Base::RejectToken
                  (&local_170,
                   (this->tok)._M_t.
                   super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl);
        token_got_string_abi_cxx11_(&local_380,(EOPlus *)&local_170,t_02);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_360,&local_380);
        pPVar1 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        iVar3 = pPVar1->line;
        iVar8 = pPVar1->reject_line;
        std::runtime_error::runtime_error(prVar4,(string *)local_320);
        if (iVar8 < iVar3) {
          iVar8 = iVar3;
        }
        *(int *)(prVar4 + 0x10) = iVar8;
        *(undefined ***)prVar4 = &PTR__runtime_error_001d17c8;
        __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_258._M_unused._M_object = (void *)0x0;
      local_258._8_8_ = 0;
      local_240 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:229:30)>
                  ::_M_invoke;
      local_248 = std::
                  _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:229:30)>
                  ::_M_manager;
      bVar2 = GetTokenIf(this,(Token *)local_2a8,
                         (function<bool_(const_EOPlus::Token_&)> *)&local_258,0x20);
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,__destroy_functor);
      }
      if (!bVar2) {
        do {
          bVar2 = GetToken(this,(Token *)local_2a8,0xe);
          if (!bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
            local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a8,"Expected function-argument in function-argument-list.",
                       "");
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
            local_360._0_8_ = *plVar5;
            plVar6 = plVar5 + 2;
            if ((long *)local_360._0_8_ == plVar6) {
              local_360._16_8_ = *plVar6;
              local_360._24_8_ = plVar5[3];
              local_360._0_8_ = local_360 + 0x10;
            }
            else {
              local_360._16_8_ = *plVar6;
            }
            local_360._8_8_ = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            Parser_Token_Server_Base::RejectToken
                      (&local_120,
                       (this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                       _M_head_impl);
            token_got_string_abi_cxx11_(&local_380,(EOPlus *)&local_120,t_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_320,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_360,&local_380);
            pPVar1 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar3 = pPVar1->line;
            iVar8 = pPVar1->reject_line;
            std::runtime_error::runtime_error(prVar4,(string *)local_320);
            if (iVar8 < iVar3) {
              iVar8 = iVar3;
            }
            *(int *)(prVar4 + 0x10) = iVar8;
            *(undefined ***)prVar4 = &PTR__runtime_error_001d17c8;
            __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::deque<util::variant,_std::allocator<util::variant>_>::push_back
                    ((deque<util::variant,_std::allocator<util::variant>_> *)local_2d0,this_00);
          local_2c8._M_unused._M_object = (void *)0x0;
          local_2c8._8_8_ = 0;
          local_2b0 = std::
                      _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:238:31)>
                      ::_M_invoke;
          local_2b8 = std::
                      _Function_handler<bool_(const_EOPlus::Token_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/eoplus/parse.cpp:238:31)>
                      ::_M_manager;
          bVar2 = GetTokenIf(this,(Token *)local_2a8,
                             (function<bool_(const_EOPlus::Token_&)> *)&local_2c8,0x60);
          if (local_2b8 != (code *)0x0) {
            (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
          }
          if (!bVar2) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x18);
            local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3a8,
                       "Expected \',\' or \')\' after function-argument in function-argument-list.",
                       "");
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_3a8);
            local_360._0_8_ = *plVar5;
            plVar6 = plVar5 + 2;
            if ((long *)local_360._0_8_ == plVar6) {
              local_360._16_8_ = *plVar6;
              local_360._24_8_ = plVar5[3];
              local_360._0_8_ = local_360 + 0x10;
            }
            else {
              local_360._16_8_ = *plVar6;
            }
            local_360._8_8_ = plVar5[1];
            *plVar5 = (long)plVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            Parser_Token_Server_Base::RejectToken
                      (&local_d0,
                       (this->tok)._M_t.
                       super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                       .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>.
                       _M_head_impl);
            token_got_string_abi_cxx11_(&local_380,(EOPlus *)&local_d0,t_01);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_320,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_360,&local_380);
            pPVar1 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            iVar3 = pPVar1->line;
            iVar8 = pPVar1->reject_line;
            std::runtime_error::runtime_error(prVar4,(string *)local_320);
            if (iVar8 < iVar3) {
              iVar8 = iVar3;
            }
            *(int *)(prVar4 + 0x10) = iVar8;
            *(undefined ***)prVar4 = &PTR__runtime_error_001d17c8;
            __cxa_throw(prVar4,&Parser_Error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar3 = util::variant::GetInt(this_00);
        } while (iVar3 != 9);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_p != &local_280) {
    operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
  }
  return local_388;
}

Assistant:

Expression Parser::ParseExpression()
	{
		Expression expression;
		Token t;

		if (this->GetToken(t, Token::Identifier))
		{
			if (std::string(t.data) == "goto")
			{
				Token tt;

				if (this->GetToken(tt, Token::Identifier))
				{
					expression.function = "setstate";
					expression.args = {std::string(tt.data)};
				}
				else
				{
					PARSER_ERROR_GOT("Expected identifier after 'goto'.");
				}
			}
			else
			{
				expression.scopes = this->ParseScopes();
				expression.function = std::string(t.data);

				if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1('('); }, Token::Operator))
				{
					if (this->GetTokenIf(t, [](const Token& t) { return int(t.data) == UOP1(')'); }, Token::Operator))
					{
						return expression;
					}

					while (this->GetToken(t, Token::String | Token::Float | Token::Integer))
					{
						expression.args.push_back(t.data);

						if (this->GetTokenIf(t, [](const Token& t)
						{
							return ((t.type == Token::Symbol && std::string(t.data) == ",")
							     || (t.type == Token::Operator && int(t.data) == UOP1(')')));
						}, Token::Symbol | Token::Operator))
						{
							if (int(t.data) == UOP1(')'))
								return expression;
						}
						else
						{
							PARSER_ERROR_GOT("Expected ',' or ')' after function-argument in function-argument-list.");
						}
					}

					PARSER_ERROR_GOT("Expected function-argument in function-argument-list.");
				}
				else
				{
					PARSER_ERROR_GOT("Expected '(' after function-name.");
				}
			}
		}

		return expression;
	}